

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void ParseIfil(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar4;
  
  if (chunklen == 4) {
    iVar1 = read_uword(f);
    iVar2 = read_uword(f);
    if (iVar1 == 2) {
      sf2->MinorVersion = iVar2;
      return;
    }
    uVar3 = __cxa_allocate_exception(1);
    ppuVar4 = &CBadVer::typeinfo;
  }
  else {
    uVar3 = __cxa_allocate_exception(1,f,CONCAT44(in_register_00000014,chunkid));
    ppuVar4 = &CBadForm::typeinfo;
  }
  __cxa_throw(uVar3,ppuVar4,0);
}

Assistant:

static void ParseIfil(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	WORD major, minor;

	if (chunklen != 4)
	{
		throw CBadForm();
	}

	major = read_uword(f);
	minor = read_uword(f);

	if (major != 2)
	{
		throw CBadVer();
	}
	sf2->MinorVersion = minor;
}